

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void log_topn_densities(float64 *den,uint32 *den_idx,uint32 n_top,uint32 n_density,uint32 veclen,
                       vector_t obs,vector_t *mean,vector_t *var,float32 *log_norm,
                       uint32 *prev_den_idx)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  float64 fVar9;
  double dVar10;
  
  uVar7 = (ulong)n_top;
  if (prev_den_idx == (uint32 *)0x0) {
    if (n_top != 0) {
      uVar6 = 0;
      do {
        den[uVar6] = -1.8e+307;
        den_idx[uVar6] = n_density + 1;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
  }
  else if (n_top != 0) {
    uVar6 = 0;
    do {
      uVar2 = prev_den_idx[uVar6];
      fVar9 = log_diag_eval(obs,log_norm[uVar2],mean[uVar2],var[uVar2],veclen);
      den_idx[uVar6] = uVar2;
      den[uVar6] = fVar9;
      uVar3 = uVar6;
      if (uVar6 != 0) {
        do {
          uVar5 = uVar3 - 1;
          dVar10 = (double)den[uVar5 & 0xffffffff];
          if ((double)fVar9 <= dVar10) goto LAB_0011346f;
          den_idx[uVar3] = den_idx[uVar5 & 0xffffffff];
          den[uVar3] = (float64)dVar10;
          uVar3 = uVar5;
        } while ((int)uVar5 != 0);
        uVar3 = 0;
LAB_0011346f:
        den_idx[uVar3 & 0xffffffff] = uVar2;
        den[uVar3 & 0xffffffff] = fVar9;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  if (n_density != 0) {
    uVar6 = (ulong)(n_top - 1);
    fVar9 = den[uVar6];
    uVar3 = 0;
    do {
      dVar10 = (double)(float)log_norm[uVar3];
      bVar8 = veclen != 0;
      if ((veclen != 0) && ((double)fVar9 < dVar10)) {
        uVar5 = 1;
        do {
          dVar10 = dVar10 - (double)(obs[uVar5 - 1] - mean[uVar3][uVar5 - 1]) *
                            (double)(obs[uVar5 - 1] - mean[uVar3][uVar5 - 1]) *
                            (double)var[uVar3][uVar5 - 1];
          bVar8 = uVar5 < veclen;
          if (!bVar8) break;
          uVar5 = uVar5 + 1;
        } while ((double)fVar9 < dVar10);
      }
      if ((!bVar8) && ((double)fVar9 < dVar10)) {
        uVar5 = uVar6;
        if (n_top == 0) {
LAB_00113574:
          do {
            uVar4 = uVar5 - 1;
            dVar1 = (double)den[uVar4 & 0xffffffff];
            if (dVar10 <= dVar1) goto LAB_001135a0;
            den_idx[uVar5] = den_idx[uVar4 & 0xffffffff];
            den[uVar5] = (float64)dVar1;
            uVar5 = uVar4;
          } while ((int)uVar4 != 0);
          uVar5 = 0;
LAB_001135a0:
          uVar5 = uVar5 & 0xffffffff;
        }
        else {
          uVar4 = 0;
          do {
            if (uVar3 == den_idx[uVar4]) goto LAB_001135b3;
            uVar4 = uVar4 + 1;
          } while (uVar7 != uVar4);
          if (n_top - 1 != 0) goto LAB_00113574;
          uVar5 = 0;
        }
        den_idx[uVar5] = (uint32)uVar3;
        den[uVar5] = (float64)dVar10;
        fVar9 = den[uVar6];
      }
LAB_001135b3:
      uVar3 = uVar3 + 1;
    } while (uVar3 != n_density);
  }
  return;
}

Assistant:

static void
log_topn_densities(float64 *den,
		   uint32 *den_idx,
		   uint32 n_top,
		   uint32 n_density,
		   uint32 veclen,
		   vector_t obs,
		   vector_t *mean,
		   vector_t *var,
		   float32 *log_norm,
		   uint32 *prev_den_idx)
{
    uint32 i, j, k;
    vector_t m;
    vector_t v;
    float64 diff;
    float64 d;
    float64 worst;	/* worst density value of the top N density values
			   seen so far */

    /* Initialize topn using the previous frame's top codeword indices */
    if (prev_den_idx) {
	for (j = 0; j < n_top; j++) {
	    i = prev_den_idx[j];
	    d = log_diag_eval(obs, log_norm[i],
			      mean[i], var[i], veclen);
	    den_idx[j] = i;
	    den[j] = d;
	    if (j == 0)
		continue;
	    /* Insertion sort them */
	    for (k = j; k > 0 && d > den[k-1]; --k) {
		den_idx[k] = den_idx[k-1];
		den[k] = den[k-1];
	    }
	    den_idx[k] = i;
	    den[k] = d;
	}
    }
    else {
	for (j = 0; j < n_top; j++) {
	    den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
	    den_idx[j] = n_density + 1; /* A non-negative invalid value */
	}
    }

    worst = den[n_top-1];

    for (i = 0; i < n_density; i++) {
	m = mean[i];
	v = var[i];

	/* Initialize distance with the log of the normalization
	   factor for this pdf. */

	d = log_norm[i];

	for (j = 0; (j < veclen) && (d > worst); j++) {
	    diff = obs[j] - m[j];
	    d -= diff * diff * v[j];
	}
	/* Not in topn, so keep going */
	if (j < veclen || d <= worst)
	    continue;

	/* This may already have been in topn from the initialization pass */
	for (j = 0; j < n_top; j++)
	    if (den_idx[j] == i)
		break;
	if (j < n_top)
	    continue; /* It's already there, don't insert it */
	for (k = n_top-1; k > 0 && d > den[k-1]; --k) {
	    den_idx[k] = den_idx[k-1];
	    den[k] = den[k-1];
	}
	den_idx[k] = i;
	den[k] = d;

	worst = den[n_top-1];
    }
    worst = den[n_top-1];
}